

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

long __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x01'>::update
          (basic_dynamic_counter<long,_(unsigned_char)__x01_> *this,label_key_type labels_value,
          long value)

{
  __int_type _Var1;
  element_type *peVar2;
  __int_type in_RDX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  *in_stack_ffffffffffffffb0;
  dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_> *in_stack_ffffffffffffffb8;
  
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)1>::
  try_emplace<std::array<std::__cxx11::string,1ul>const&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  peVar2 = std::
           __shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a0b06);
  LOCK();
  _Var1 = (peVar2->value).super___atomic_base<long>._M_i;
  (peVar2->value).super___atomic_base<long>._M_i = in_RDX;
  UNLOCK();
  std::
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::metric_pair>,_bool>
  ::~pair((pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>::metric_pair>,_bool>
           *)0x1a0bd4);
  return _Var1;
}

Assistant:

value_type update(label_key_type labels_value, value_type value) {
    return Base::try_emplace(labels_value)
        .first->value.exchange(value, std::memory_order::relaxed);
  }